

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qauthenticator.cpp
# Opt level: O2

QString * __thiscall QAuthenticator::user(QString *__return_storage_ptr__,QAuthenticator *this)

{
  if (this->d == (QAuthenticatorPrivate *)0x0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    QArrayDataPointer<char16_t>::QArrayDataPointer
              (&__return_storage_ptr__->d,(QArrayDataPointer<char16_t> *)this->d);
  }
  return __return_storage_ptr__;
}

Assistant:

QString QAuthenticator::user() const
{
    return d ? d->user : QString();
}